

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O2

void __thiscall QColumnViewGrip::mouseDoubleClickEvent(QColumnViewGrip *this,QMouseEvent *event)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  plVar1 = *(long **)(*(long *)(this + 8) + 0x10);
  iVar3 = (**(code **)(*plVar1 + 0x70))(plVar1);
  iVar4 = ~*(uint *)(plVar1[4] + 0x1c) + iVar3 + *(int *)(plVar1[4] + 0x14);
  bVar2 = QWidget::isRightToLeft((QWidget *)this);
  iVar3 = -iVar4;
  if (!bVar2) {
    iVar3 = iVar4;
  }
  moveGrip(this,iVar3);
  event[0xc] = (QMouseEvent)0x1;
  return;
}

Assistant:

void QColumnViewGrip::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_UNUSED(event);
    QWidget *parentWidget = (QWidget*)parent();
    int offset = parentWidget->sizeHint().width() - parentWidget->width();
    if (isRightToLeft())
        offset *= -1;
    moveGrip(offset);
    event->accept();
}